

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

void duckdb_je_emap_merge_commit
               (tsdn_t *tsdn,emap_t *emap,emap_prepare_t *prepare,edata_t *lead,edata_t *trail)

{
  rtree_leaf_elm_t *prVar1;
  rtree_leaf_elm_t **pprVar2;
  szind_t in_R9D;
  _Bool in_stack_00000008;
  
  if (prepare->lead_elm_b != (rtree_leaf_elm_t *)0x0) {
    (prepare->lead_elm_b->le_bits).repr = (void *)0xe8000000000000;
  }
  pprVar2 = &prepare->trail_elm_a;
  if (prepare->trail_elm_b != (rtree_leaf_elm_t *)0x0) {
    prVar1 = *pprVar2;
    pprVar2 = &prepare->trail_elm_b;
    (prVar1->le_bits).repr = (void *)0xe8000000000000;
  }
  emap_rtree_write_acquired
            ((tsdn_t *)prepare->lead_elm_a,(emap_t *)*pprVar2,(rtree_leaf_elm_t *)lead,
             (rtree_leaf_elm_t *)0xe8,(edata_t *)0x0,in_R9D,in_stack_00000008);
  return;
}

Assistant:

void
emap_merge_commit(tsdn_t *tsdn, emap_t *emap, emap_prepare_t *prepare,
    edata_t *lead, edata_t *trail) {
	rtree_contents_t clear_contents;
	clear_contents.edata = NULL;
	clear_contents.metadata.szind = SC_NSIZES;
	clear_contents.metadata.slab = false;
	clear_contents.metadata.is_head = false;
	clear_contents.metadata.state = (extent_state_t)0;

	if (prepare->lead_elm_b != NULL) {
		rtree_leaf_elm_write(tsdn, &emap->rtree,
		    prepare->lead_elm_b, clear_contents);
	}

	rtree_leaf_elm_t *merged_b;
	if (prepare->trail_elm_b != NULL) {
		rtree_leaf_elm_write(tsdn, &emap->rtree,
		    prepare->trail_elm_a, clear_contents);
		merged_b = prepare->trail_elm_b;
	} else {
		merged_b = prepare->trail_elm_a;
	}

	emap_rtree_write_acquired(tsdn, emap, prepare->lead_elm_a, merged_b,
	    lead, SC_NSIZES, false);
}